

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::is_per_primitive_variable(CompilerGLSL *this,SPIRVariable *var)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  SPIRType *pSVar4;
  uint32_t index;
  
  bVar2 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                     DecorationPerPrimitiveEXT);
  bVar3 = true;
  if (!bVar2) {
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(var->super_IVariant).field_0xc);
    bVar2 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,Block);
    if (bVar2) {
      iVar1 = (int)(pSVar4->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      if (iVar1 != 0) {
        index = 0;
        do {
          bVar3 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,index,
                             DecorationPerPrimitiveEXT);
          if (!bVar3) {
            return bVar3;
          }
          bVar2 = iVar1 - 1U != index;
          index = index + 1;
        } while (bVar2);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool CompilerGLSL::is_per_primitive_variable(const SPIRVariable &var) const
{
	if (has_decoration(var.self, DecorationPerPrimitiveEXT))
		return true;

	auto &type = get<SPIRType>(var.basetype);
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0, n = uint32_t(type.member_types.size()); i < n; i++)
		if (!has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			return false;

	return true;
}